

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monochrome_test.cc
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_12c79ba::MonochromeTest::ComparePlaneToValue
          (MonochromeTest *this,aom_image_t *img,int plane,int value)

{
  byte *pbVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  int c;
  ulong uVar7;
  ulong uVar8;
  
  uVar2 = aom_img_plane_width((aom_image_t *)this,(int)img);
  uVar3 = aom_img_plane_height((aom_image_t *)this,(int)img);
  lVar5 = *(long *)(&(this->super_EncoderTest).cfg_.g_h + ((ulong)img & 0xffffffff) * 2);
  uVar4 = 0;
  uVar8 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar8 = uVar4;
  }
  uVar6 = 0;
  if (0 < (int)uVar3) {
    uVar6 = (ulong)uVar3;
  }
  for (; uVar4 != uVar6; uVar4 = uVar4 + 1) {
    uVar7 = 0;
    while (uVar8 != uVar7) {
      pbVar1 = (byte *)(lVar5 + uVar7);
      uVar7 = uVar7 + 1;
      if ((uint)*pbVar1 != plane) goto LAB_005e3457;
    }
    lVar5 = lVar5 + (&(this->super_EncoderTest).cfg_.g_timebase.num)[(ulong)img & 0xffffffff];
  }
LAB_005e3457:
  return (long)(int)uVar3 <= (long)uVar4;
}

Assistant:

bool ComparePlaneToValue(const aom_image_t &img, const int plane,
                           const int value) {
    const int w = aom_img_plane_width(&img, plane);
    const int h = aom_img_plane_height(&img, plane);
    const uint8_t *const buf = img.planes[plane];
    const int stride = img.stride[plane];

    for (int r = 0; r < h; ++r) {
      for (int c = 0; c < w; ++c) {
        if (buf[r * stride + c] != value) return false;
      }
    }
    return true;
  }